

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_tracek(lua_State *L)

{
  uint64_t uVar1;
  long lVar2;
  TValue *pTVar3;
  IROp1 IVar4;
  uint uVar5;
  int iVar6;
  IRIns *ir;
  
  uVar5 = lj_lib_checkint(L,1);
  if ((uVar5 == 0) || (uVar1 = (L->glref).ptr64, *(uint *)(uVar1 + 0x46c) <= uVar5)) {
    lj_lib_checkint(L,2);
    iVar6 = 0;
  }
  else {
    lVar2 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar5 * 8);
    uVar5 = lj_lib_checkint(L,2);
    iVar6 = 0;
    if (((lVar2 != 0) && (0xffff7fff < uVar5)) && (*(uint *)(lVar2 + 0x28) <= uVar5 + 0x8000)) {
      ir = (IRIns *)(*(long *)(lVar2 + 0x20) + (ulong)(uVar5 + 0x8000) * 8);
      IVar4 = (ir->field_1).o;
      uVar5 = 0xffffffff;
      if (IVar4 == '\x1e') {
        uVar5 = (uint)(ir->field_0).op2;
        ir = (IRIns *)(*(long *)(lVar2 + 0x20) + (ulong)(ir->field_0).op1 * 8);
        IVar4 = (ir->field_1).o;
      }
      if ((IVar4 == '\x1d') && (*(long *)((L->glref).ptr64 + 0x180) == 0)) {
        pTVar3 = L->top;
        uVar1 = (L->stack).ptr64;
        luaopen_ffi(L);
        L->top = (TValue *)((long)pTVar3 + ((L->stack).ptr64 - uVar1));
      }
      lj_ir_kvalue(L,L->top + -2,ir);
      L->top[-1].n = (double)((ir->field_1).t.irt & 0x1f);
      if (uVar5 == 0xffffffff) {
        iVar6 = 2;
      }
      else {
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        pTVar3->n = (double)(int)uVar5;
        iVar6 = 3;
      }
    }
  }
  return iVar6;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
#if LJ_HASFFI
    if (ir->o == IR_KINT64) ctype_loadffi(L);
#endif
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}